

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

int pkey_gost2001cp_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  EC_KEY *ec;
  
  iVar1 = pkey_gost2001_paramgen(ctx,pkey);
  if (iVar1 != 0) {
    ec = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pkey);
    gost_ec_keygen(ec);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int pkey_gost2001cp_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey)
{
    EC_KEY *ec;
    if (!pkey_gost2001_paramgen(ctx, pkey))
        return 0;
    ec = EVP_PKEY_get0(pkey);
    gost_ec_keygen(ec);
    return 1;
}